

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDImporter.cpp
# Opt level: O1

void __thiscall Assimp::MMDImporter::MMDImporter(MMDImporter *this)

{
  DefaultIOSystem io;
  DefaultIOSystem local_48;
  
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_008efb40;
  (this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->m_strAbsPath)._M_dataplus._M_p = (pointer)&(this->m_strAbsPath).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_strAbsPath);
  local_48.super_IOSystem.m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super_IOSystem.m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super_IOSystem.m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super_IOSystem._vptr_IOSystem = (_func_int **)&PTR__IOSystem_0081ea00;
  DefaultIOSystem::getOsSeparator(&local_48);
  std::__cxx11::string::_M_replace_aux
            ((ulong)&this->m_strAbsPath,0,(this->m_strAbsPath)._M_string_length,'\x01');
  local_48.super_IOSystem._vptr_IOSystem = (_func_int **)&PTR__IOSystem_0081ca98;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48.super_IOSystem.m_pathStack);
  return;
}

Assistant:

MMDImporter::MMDImporter()
: m_Buffer()
, m_strAbsPath("") {
    DefaultIOSystem io;
    m_strAbsPath = io.getOsSeparator();
}